

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcOffsetCurve3D::IfcOffsetCurve3D(IfcOffsetCurve3D *this)

{
  *(undefined ***)&this->field_0x68 = &PTR__Object_007331c0;
  *(undefined8 *)&this->field_0x70 = 0;
  *(char **)&this->field_0x78 = "IfcOffsetCurve3D";
  IfcCurve::IfcCurve(&this->super_IfcCurve,&PTR_construction_vtable_24__007680d0);
  *(undefined8 *)&(this->super_IfcCurve).field_0x38 = 0;
  *(undefined8 *)&(this->super_IfcCurve).field_0x40 = 0;
  (this->super_IfcCurve).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x768018;
  *(undefined8 *)&this->field_0x68 = 0x7680b8;
  *(undefined8 *)
   &(this->super_IfcCurve).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x768040;
  *(undefined8 *)
   &(this->super_IfcCurve).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x768068;
  *(undefined8 *)&(this->super_IfcCurve).super_IfcGeometricRepresentationItem.field_0x30 = 0x768090;
  (this->SelfIntersect).
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->SelfIntersect).
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->RefDirection).obj = (LazyObject *)0x0;
  return;
}

Assistant:

IfcOffsetCurve3D() : Object("IfcOffsetCurve3D") {}